

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O1

void lightconf::config_format::write_group(scanner *sc,writer *wr,bool braces,group *gr)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pbVar5;
  pointer ptVar6;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pcVar7;
  undefined4 uVar10;
  undefined4 uVar11;
  bool bVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  pointer ptVar15;
  char cVar16;
  int iVar17;
  ulong uVar18;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __position;
  size_type sVar19;
  return_type<lightconf::value> pvVar20;
  uint uVar21;
  undefined7 in_register_00000011;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  pointer pbVar22;
  ulong uVar23;
  scanner *this;
  _Alloc_hider _Var24;
  bool bVar25;
  string key_1;
  scanner dummy_scanner;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  group *__range2;
  _Any_data local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  undefined4 local_220;
  undefined1 local_218 [8];
  char *local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  vector<lightconf::token,_std::allocator<lightconf::token>_> local_1f8;
  uint uStack_1e0;
  undefined4 uStack_1dc;
  undefined8 local_1d8;
  int local_1d0;
  _Any_data local_1c8;
  _Manager_type local_1b8;
  _Invoker_type p_Stack_1b0;
  int local_1a8;
  scanner *local_1a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_198;
  group *local_180;
  undefined1 local_178 [40];
  token_type local_150;
  undefined1 *local_148;
  undefined8 local_140;
  undefined1 local_138 [16];
  double local_128;
  uint uStack_120;
  int iStack_11c;
  undefined4 uStack_118;
  undefined4 local_114;
  token_type local_110;
  undefined1 *local_108;
  undefined8 local_100;
  undefined1 local_f8 [16];
  double local_e8;
  uint uStack_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 local_d4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_d0;
  value local_c8;
  
  bVar12 = true;
  local_180 = gr;
  if ((int)CONCAT71(in_register_00000011,braces) != 0) {
    iVar17 = group_length(gr,0x78);
    bVar12 = wr->wrap_length < iVar17;
  }
  if (braces) {
    local_218 = (undefined1  [8])&local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"{ ","");
    std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
    wr->col = wr->col + (int)local_210;
    if (local_218 != (undefined1  [8])&local_208) {
      operator_delete((void *)local_218);
    }
    writer::indent(wr);
    if (bVar12) {
      writer::newline(wr);
    }
    scanner::expect(sc,'{',false);
  }
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_198.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbVar22 = (local_180->order_).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (local_180->order_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar22 != pbVar5) {
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_198,pbVar22);
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar5);
  }
  local_1a0 = sc;
  do {
    uVar21 = local_1a0->cur_token_;
    ptVar6 = (local_1a0->tokens_).
             super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (long)(local_1a0->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar6 >> 6;
    do {
      uVar23 = (ulong)uVar21;
      if (uVar18 <= uVar23) break;
      uVar21 = uVar21 + 1;
    } while (ptVar6[uVar23].type - whitespace_token < 2);
    if (uVar18 == uVar23) {
      local_218._0_4_ = 7;
      local_210 = local_208._M_local_buf + 8;
      local_208._M_allocated_capacity = 0;
      local_208._M_local_buf[8] = '\0';
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_1e0 = 0;
      uStack_1dc._0_1_ = false;
      uStack_1dc._1_3_ = 0;
    }
    else {
      local_218._0_4_ = ptVar6[uVar23].type;
      local_210 = local_208._M_local_buf + 8;
      pcVar7 = ptVar6[uVar23].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_210,pcVar7,pcVar7 + ptVar6[uVar23].string_value._M_string_length);
      uVar1 = ptVar6[uVar23].line;
      uVar8 = ptVar6[uVar23].col;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = *(undefined4 *)&ptVar6[uVar23].number_value;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ =
           *(undefined4 *)((long)&ptVar6[uVar23].number_value + 4);
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = *(uint *)&ptVar6[uVar23].char_value;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = ptVar6[uVar23].pos;
      uStack_1e0 = uVar1;
      uStack_1dc = uVar8;
    }
    bVar25 = local_218._0_4_ != 7;
    cVar16 = bVar25 && braces;
    if (bVar25 && braces) {
      uVar21 = local_1a0->cur_token_;
      ptVar6 = (local_1a0->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)(local_1a0->tokens_).
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ptVar6 >> 6;
      do {
        uVar23 = (ulong)uVar21;
        if (uVar18 <= uVar23) break;
        uVar21 = uVar21 + 1;
      } while (ptVar6[uVar23].type - whitespace_token < 2);
      if (uVar18 == uVar23) {
        local_110 = eof_token;
        local_108 = local_f8;
        local_100 = 0;
        local_f8[0] = 0;
        local_e8 = 0.0;
        uStack_e0 = uStack_e0 & 0xffffff00;
        uStack_dc = 0;
        uStack_d8 = 0;
        local_d4 = 0;
      }
      else {
        local_110 = ptVar6[uVar23].type;
        local_108 = local_f8;
        pcVar7 = ptVar6[uVar23].string_value._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_108,pcVar7,pcVar7 + ptVar6[uVar23].string_value._M_string_length
                  );
        uVar2 = ptVar6[uVar23].line;
        uVar9 = ptVar6[uVar23].col;
        local_e8 = ptVar6[uVar23].number_value;
        ptVar6 = ptVar6 + uVar23;
        uVar13._0_1_ = ptVar6->char_value;
        uVar13._1_3_ = *(undefined3 *)&ptVar6->field_0x31;
        uVar13._4_4_ = ptVar6->pos;
        uStack_e0 = (uint)uVar13;
        uStack_dc = uVar13._4_4_;
        uStack_d8 = uVar2;
        local_d4 = uVar9;
      }
      bVar25 = (char)uStack_e0 != '}' || local_110 != char_token;
      cVar16 = braces;
    }
    if ((cVar16 != '\0') && (local_108 != local_f8)) {
      operator_delete(local_108);
    }
    if (local_210 != local_208._M_local_buf + 8) {
      operator_delete(local_210);
    }
    this = local_1a0;
    if (!bVar25) break;
    scanner::expect_identifier_abi_cxx11_((string *)&local_240,local_1a0);
    scanner::expect(this,'=',false);
    __position = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (local_198.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            local_198.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,&local_240);
    if (__position._M_current ==
        local_198.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      read_value(&local_c8,this);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.group_value_.order_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&local_c8.group_value_);
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
                (&local_c8.vector_value_);
      _Var24._M_p = local_c8.string_value_._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.string_value_._M_dataplus._M_p != &local_c8.string_value_.field_2)
      goto LAB_00113aee;
    }
    else {
      std::__cxx11::string::_M_append((char *)wr,local_240._M_unused._M_member_pointer);
      wr->col = wr->col + local_240._8_4_;
      local_218 = (undefined1  [8])&local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218," = ","");
      std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
      wr->col = wr->col + (int)local_210;
      if (local_218 != (undefined1  [8])&local_208) {
        operator_delete((void *)local_218);
      }
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = (pointer)0x0;
      local_178._16_8_ = (pointer)0x0;
      if ((__position._M_current)->_M_string_length != 0) {
        uVar18 = 0;
        do {
          sVar19 = std::__cxx11::string::find((char)__position._M_current,0x2e);
          if (sVar19 == 0xffffffffffffffff) {
            sVar19 = (__position._M_current)->_M_string_length;
          }
          pcVar7 = ((__position._M_current)->_M_dataplus)._M_p;
          local_218 = (undefined1  [8])&local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,pcVar7 + uVar18,pcVar7 + sVar19);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178,(value_type *)local_218);
          if (local_218 != (undefined1  [8])&local_208) {
            operator_delete((void *)local_218);
          }
          uVar18 = sVar19 + 1;
        } while (uVar18 < (__position._M_current)->_M_string_length);
      }
      pvVar20 = group::get<lightconf::value>(local_180,(path *)local_178);
      this = local_1a0;
      write_value(local_1a0,wr,pvVar20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_178);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase(&local_198,(iterator)__position._M_current);
      uVar21 = this->cur_token_;
      ptVar6 = (this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)(this->tokens_).
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ptVar6 >> 6;
      do {
        uVar23 = (ulong)uVar21;
        if (uVar18 <= uVar23) break;
        uVar21 = uVar21 + 1;
      } while (ptVar6[uVar23].type - whitespace_token < 2);
      if (uVar18 == uVar23) {
        local_218._0_4_ = 7;
        local_210 = local_208._M_local_buf + 8;
        local_208._M_allocated_capacity = 0;
        local_208._M_local_buf[8] = '\0';
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ = 0;
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (uint)local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
        uStack_1e0 = 0;
        uStack_1dc._0_1_ = false;
        uStack_1dc._1_3_ = 0;
      }
      else {
        local_218._0_4_ = ptVar6[uVar23].type;
        local_210 = local_208._M_local_buf + 8;
        pcVar7 = ptVar6[uVar23].string_value._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_210,pcVar7,pcVar7 + ptVar6[uVar23].string_value._M_string_length
                  );
        uVar3 = ptVar6[uVar23].line;
        uVar10 = ptVar6[uVar23].col;
        ptVar15 = ptVar6 + uVar23;
        uVar14._0_1_ = ptVar15->char_value;
        uVar14._1_3_ = *(undefined3 *)&ptVar15->field_0x31;
        uVar14._4_4_ = ptVar15->pos;
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._0_4_ = SUB84(ptVar6[uVar23].number_value,0);
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_finish._4_4_ =
             (undefined4)((ulong)ptVar6[uVar23].number_value >> 0x20);
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)uVar14;
        local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = uVar14._4_4_;
        uStack_1e0 = uVar3;
        uStack_1dc = uVar10;
      }
      pbVar5 = local_198.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar22 = local_198.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((local_218._0_4_ == 4) &&
         ((char)local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage == '}')) {
        if (local_210 != local_208._M_local_buf + 8) {
          operator_delete(local_210);
        }
        if (pbVar22 != pbVar5) goto LAB_00113a9d;
        if (bVar12) goto LAB_00113af3;
        local_218 = (undefined1  [8])&local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218," ","");
        std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
      }
      else {
        if (local_210 != local_208._M_local_buf + 8) {
          operator_delete(local_210);
        }
LAB_00113a9d:
        if (bVar12) {
          writer::newline(wr);
          goto LAB_00113af3;
        }
        local_218 = (undefined1  [8])&local_208;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_218,", ","");
        std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
      }
      wr->col = wr->col + (int)local_210;
      _Var24._M_p = (pointer)local_218;
      if (local_218 != (undefined1  [8])&local_208) {
LAB_00113aee:
        operator_delete(_Var24._M_p);
      }
    }
LAB_00113af3:
    scanner::expect(this,',',true);
    if (braces) {
      uVar21 = this->cur_token_;
      ptVar6 = (this->tokens_).
               super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar18 = (long)(this->tokens_).
                     super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl
                     .super__Vector_impl_data._M_finish - (long)ptVar6 >> 6;
      do {
        uVar23 = (ulong)uVar21;
        if (uVar18 <= uVar23) break;
        uVar21 = uVar21 + 1;
      } while (ptVar6[uVar23].type - whitespace_token < 2);
      if (uVar18 == uVar23) {
        local_150 = eof_token;
        local_148 = local_138;
        local_140 = 0;
        local_138[0] = 0;
        local_128 = 0.0;
        uStack_120 = uStack_120 & 0xffffff00;
        iStack_11c = 0;
        uStack_118 = 0;
        local_114 = 0;
      }
      else {
        local_150 = ptVar6[uVar23].type;
        local_148 = local_138;
        pcVar7 = ptVar6[uVar23].string_value._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_148,pcVar7,pcVar7 + ptVar6[uVar23].string_value._M_string_length
                  );
        uVar4 = ptVar6[uVar23].line;
        uVar11 = ptVar6[uVar23].col;
        local_128 = ptVar6[uVar23].number_value;
        uStack_120 = *(uint *)&ptVar6[uVar23].char_value;
        iStack_11c = ptVar6[uVar23].pos;
        uStack_118 = uVar4;
        local_114 = uVar11;
      }
      bVar25 = (char)uStack_120 == '}' && local_150 == char_token;
    }
    else {
      bVar25 = false;
    }
    if ((braces) && (local_148 != local_138)) {
      operator_delete(local_148);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_unused._0_8_ != &local_230) {
      operator_delete(local_240._M_unused._M_object);
    }
  } while (!bVar25);
  local_d0 = local_198.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_198.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    uVar18 = 0;
    pbVar22 = local_198.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__cxx11::string::_M_append((char *)wr,(ulong)(pbVar22->_M_dataplus)._M_p);
      wr->col = wr->col + (int)pbVar22->_M_string_length;
      local_218 = (undefined1  [8])&local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218," = ","");
      std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
      wr->col = wr->col + (int)local_210;
      if (local_218 != (undefined1  [8])&local_208) {
        operator_delete((void *)local_218);
      }
      local_178._0_8_ = local_178 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"0","");
      local_218 = (undefined1  [8])&local_208;
      local_210 = (char *)0x0;
      local_208._M_allocated_capacity = local_208._M_allocated_capacity & 0xffffffffffffff00;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_1e0 = 0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_1f8.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uStack_1dc._0_1_ = true;
      local_1d8._0_4_ = 0;
      local_1d8._4_4_ = 1;
      local_1d0 = 1;
      local_1b8 = (_Manager_type)0x0;
      p_Stack_1b0 = (_Invoker_type)0x0;
      local_1c8._M_unused._M_object = (void *)0x0;
      local_1c8._8_8_ = 0;
      local_1a8 = 0;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_240,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)default_scanner_params);
      local_220 = default_scanner_params._32_4_;
      scanner::scan((scanner *)local_218,(string *)local_178,(scanner_params *)&local_240);
      if ((code *)local_230._M_allocated_capacity != (code *)0x0) {
        (*(code *)local_230._M_allocated_capacity)(&local_240,&local_240,3);
      }
      if ((pointer)local_178._0_8_ != (pointer)(local_178 + 0x10)) {
        operator_delete((void *)local_178._0_8_);
      }
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = (pointer)0x0;
      local_178._16_8_ = (pointer)0x0;
      if (pbVar22->_M_string_length != 0) {
        uVar23 = 0;
        do {
          sVar19 = std::__cxx11::string::find((char)pbVar22,0x2e);
          if (sVar19 == 0xffffffffffffffff) {
            sVar19 = pbVar22->_M_string_length;
          }
          pcVar7 = (pbVar22->_M_dataplus)._M_p;
          local_240._M_unused._M_object = &local_230;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,pcVar7 + uVar23,pcVar7 + sVar19);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_178,(value_type *)&local_240);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_unused._0_8_ != &local_230) {
            operator_delete(local_240._M_unused._M_object);
          }
          uVar23 = sVar19 + 1;
        } while (uVar23 < pbVar22->_M_string_length);
      }
      pvVar20 = group::get<lightconf::value>(local_180,(path *)local_178);
      write_value((scanner *)local_218,wr,pvVar20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_178);
      if (uVar18 < ((long)local_198.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_198.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        if (bVar12) {
          writer::newline(wr);
        }
        else {
          local_240._M_unused._M_object = &local_230;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,", ","");
          std::__cxx11::string::_M_append((char *)wr,local_240._M_unused._M_member_pointer);
LAB_00113f42:
          wr->col = wr->col + local_240._8_4_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_unused._0_8_ != &local_230) {
            operator_delete(local_240._M_unused._M_object);
          }
        }
      }
      else if (!bVar12) {
        local_240._M_unused._M_object = &local_230;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_240," ","");
        std::__cxx11::string::_M_append((char *)wr,local_240._M_unused._M_member_pointer);
        goto LAB_00113f42;
      }
      if (local_1b8 != (_Manager_type)0x0) {
        (*local_1b8)(&local_1c8,&local_1c8,__destroy_functor);
      }
      std::vector<lightconf::token,_std::allocator<lightconf::token>_>::~vector(&local_1f8);
      if (local_218 != (undefined1  [8])&local_208) {
        operator_delete((void *)local_218);
      }
      uVar18 = (ulong)((int)uVar18 + 1);
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != local_d0);
  }
  if (braces) {
    std::deque<int,_std::allocator<int>_>::pop_back(&(wr->tabstops).c);
    if (bVar12) {
      writer::newline(wr);
    }
    scanner::expect(local_1a0,'}',false);
    local_218 = (undefined1  [8])&local_208;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"}","");
    std::__cxx11::string::_M_append((char *)wr,(ulong)local_218);
    wr->col = wr->col + (int)local_210;
    if (local_218 != (undefined1  [8])&local_208) {
      operator_delete((void *)local_218);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_198);
  return;
}

Assistant:

inline void write_group(scanner& sc, writer& wr, bool braces, const group& gr) {
    bool wrap = !braces || group_length(gr) > wr.wrap_length;

    if (braces) {
        wr.append("{ ");
        wr.indent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('{');
    }

    std::vector<std::string> keys;
    for (const auto& key : gr) {
        keys.push_back(key);
    }

    while (sc.peek_token().type != token_type::eof_token && !(braces && sc.peek_token().is_char('}'))) {
        std::string key = sc.expect_identifier();
        sc.expect('=');

        auto key_it = std::find(std::begin(keys), std::end(keys), key);
        if (key_it != keys.end()) {
            wr.append(key);
            wr.append(" = ");
            write_value(sc, wr, gr.get<value>(*key_it));
            keys.erase(key_it);
            bool terminate = sc.peek_token().is_char('}') && keys.empty();
            if (!terminate) {
                if (wrap) {
                    wr.newline();
                } else {
                    wr.append(", ");
                }
            } else if (!wrap) {
                wr.append(" ");
            }
        } else {
            read_value(sc);
        }

        sc.expect(',', true);
        if (braces && sc.peek_token().is_char('}')) {
            break;
        }
    }

    unsigned int i = 0;
    for (const auto& key : keys) {
        wr.append(key);
        wr.append(" = ");
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, gr.get<value>(key));
        if (i < keys.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        i++;
    }

    if (braces) {
        wr.unindent();
        if (wrap) {
            wr.newline();
        }
        sc.expect('}');
        wr.append("}");
    }
}